

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LLVMDependenceGraphBuilder.h
# Opt level: O0

unique_ptr<dg::LLVMDependenceGraph,_std::default_delete<dg::LLVMDependenceGraph>_> * __thiscall
dg::llvmdg::LLVMDependenceGraphBuilder::build(LLVMDependenceGraphBuilder *this)

{
  LLVMPointerAnalysis *pLVar1;
  bool bVar2;
  LLVMDependenceGraphBuilder *this_00;
  LLVMDataDependenceAnalysis *pLVar3;
  pointer pLVar4;
  pointer pLVar5;
  pointer pCVar6;
  ulong uVar7;
  undefined8 *in_RDI;
  pointer in_stack_ffffffffffffffc8;
  LLVMDependenceGraphBuilder *in_stack_ffffffffffffffd0;
  unique_ptr<dg::LLVMDependenceGraph,_std::default_delete<dg::LLVMDependenceGraph>_> *local_8;
  
  _runPointerAnalysis(in_stack_ffffffffffffffd0);
  _runDataDependenceAnalysis(in_stack_ffffffffffffffd0);
  this_00 = (LLVMDependenceGraphBuilder *)
            std::unique_ptr<dg::LLVMDependenceGraph,_std::default_delete<dg::LLVMDependenceGraph>_>
            ::operator->((unique_ptr<dg::LLVMDependenceGraph,_std::default_delete<dg::LLVMDependenceGraph>_>
                          *)0x18a793);
  pLVar1 = (LLVMPointerAnalysis *)*in_RDI;
  pLVar3 = (LLVMDataDependenceAnalysis *)
           std::unique_ptr<dg::LLVMPointerAnalysis,_std::default_delete<dg::LLVMPointerAnalysis>_>::
           get((unique_ptr<dg::LLVMPointerAnalysis,_std::default_delete<dg::LLVMPointerAnalysis>_> *
               )0x18a7b1);
  pLVar4 = std::
           unique_ptr<dg::dda::LLVMDataDependenceAnalysis,_std::default_delete<dg::dda::LLVMDataDependenceAnalysis>_>
           ::get((unique_ptr<dg::dda::LLVMDataDependenceAnalysis,_std::default_delete<dg::dda::LLVMDataDependenceAnalysis>_>
                  *)0x18a7c7);
  dg::LLVMDependenceGraph::build((Module *)this_00,pLVar1,pLVar3,(Function *)pLVar4);
  pLVar5 = std::unique_ptr<dg::LLVMDependenceGraph,_std::default_delete<dg::LLVMDependenceGraph>_>::
           operator->((unique_ptr<dg::LLVMDependenceGraph,_std::default_delete<dg::LLVMDependenceGraph>_>
                       *)0x18a7fb);
  dg::LLVMDependenceGraph::addDefUseEdges(SUB81(pLVar5,0));
  _runControlDependenceAnalysis(this_00);
  if ((*(byte *)((long)in_RDI + 0x179) & 1) != 0) {
    bVar2 = LLVMPointerAnalysisOptions::isSVF((LLVMPointerAnalysisOptions *)(in_RDI + 1));
    if (bVar2) {
      abort();
    }
    pCVar6 = std::unique_ptr<ControlFlowGraph,_std::default_delete<ControlFlowGraph>_>::operator->
                       ((unique_ptr<ControlFlowGraph,_std::default_delete<ControlFlowGraph>_> *)
                        0x18a855);
    ControlFlowGraph::buildFunction((Function *)pCVar6);
    _runInterferenceDependenceAnalysis(this_00);
    _runForkJoinAnalysis(this_00);
    _runCriticalSectionAnalysis(this_00);
  }
  if ((*(byte *)(in_RDI + 0x2f) & 1) != 0) {
    std::unique_ptr<dg::LLVMDependenceGraph,_std::default_delete<dg::LLVMDependenceGraph>_>::
    operator->((unique_ptr<dg::LLVMDependenceGraph,_std::default_delete<dg::LLVMDependenceGraph>_> *
               )0x18a8a6);
    uVar7 = dg::LLVMDependenceGraph::verify();
    if ((uVar7 & 1) == 0) {
      std::unique_ptr<dg::LLVMDependenceGraph,_std::default_delete<dg::LLVMDependenceGraph>_>::reset
                ((unique_ptr<dg::LLVMDependenceGraph,_std::default_delete<dg::LLVMDependenceGraph>_>
                  *)this_00,in_stack_ffffffffffffffc8);
    }
  }
  local_8 = (unique_ptr<dg::LLVMDependenceGraph,_std::default_delete<dg::LLVMDependenceGraph>_> *)
            (in_RDI + 0x37);
  return local_8;
}

Assistant:

std::unique_ptr<LLVMDependenceGraph> &&build() {
        // compute data dependencies
        _runPointerAnalysis();
        _runDataDependenceAnalysis();

        // build the graph itself (the nodes, but without edges)
        _dg->build(_M, _PTA.get(), _DDA.get(), _entryFunction);

        // insert the data dependencies edges
        _dg->addDefUseEdges(_options.preserveDbg);

        // compute and fill-in control dependencies
        _runControlDependenceAnalysis();

        if (_options.threads) {
            if (_options.PTAOptions.isSVF()) {
                assert(0 && "Threading needs the DG pointer analysis, SVF is "
                            "not supported yet");
                abort();
            }
            _controlFlowGraph->buildFunction(_entryFunction);
            _runInterferenceDependenceAnalysis();
            _runForkJoinAnalysis();
            _runCriticalSectionAnalysis();
        }

        // verify if the graph is built correctly
        if (_options.verifyGraph && !_dg->verify()) {
            _dg.reset();
            return std::move(_dg);
        }

        return std::move(_dg);
    }